

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::Constraint::isFeasiblePoint
          (Constraint *this,double time,VectorDynSize *state,VectorDynSize *control)

{
  double dVar1;
  uint uVar2;
  size_t sVar3;
  double *pdVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  Constraint *in_RDI;
  undefined8 in_XMM0_Qa;
  uint i;
  uint local_2c;
  
  if (((in_RDI->m_isUpperBounded & 1U) != 0) || ((in_RDI->m_isLowerBounded & 1U) != 0)) {
    uVar2 = (*in_RDI->_vptr_Constraint[3])(in_XMM0_Qa,in_RDI,in_RSI,in_RDX,&in_RDI->m_valueBuffer);
    if ((uVar2 & 1) == 0) {
      iDynTree::reportError("Constraint","isFeasiblePoint","Failed to evaluate constraint.");
    }
    for (local_2c = 0; sVar3 = constraintSize(in_RDI), local_2c < sVar3; local_2c = local_2c + 1) {
      if ((in_RDI->m_isLowerBounded & 1U) != 0) {
        pdVar4 = (double *)
                 iDynTree::VectorDynSize::operator()(&in_RDI->m_valueBuffer,(ulong)local_2c);
        dVar1 = *pdVar4;
        pdVar4 = (double *)
                 iDynTree::VectorDynSize::operator()(&in_RDI->m_lowerBound,(ulong)local_2c);
        if (dVar1 < *pdVar4) {
          return false;
        }
      }
      if ((in_RDI->m_isUpperBounded & 1U) != 0) {
        pdVar4 = (double *)
                 iDynTree::VectorDynSize::operator()(&in_RDI->m_valueBuffer,(ulong)local_2c);
        dVar1 = *pdVar4;
        pdVar4 = (double *)
                 iDynTree::VectorDynSize::operator()(&in_RDI->m_upperBound,(ulong)local_2c);
        if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Constraint::isFeasiblePoint(double time, const VectorDynSize &state, const VectorDynSize &control)
        {
            if (!m_isUpperBounded && !m_isLowerBounded) {
                return true;
            }

            if (!evaluateConstraint(time, state, control, m_valueBuffer)){
                reportError("Constraint", "isFeasiblePoint", "Failed to evaluate constraint.");
                assert(false);
            }

            for (unsigned int i = 0; i < constraintSize(); ++i){
                if (m_isLowerBounded) {
                    if (m_valueBuffer(i) < m_lowerBound(i)) {
                        return false;
                    }
                }

                if (m_isUpperBounded) {
                    if (m_valueBuffer(i) > m_upperBound(i)) {
                        return false;
                    }
                }
            }
            return true;
        }